

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

int f(int h,int m,uint *I2_start,uint *I2_end)

{
  int iVar1;
  long in_RCX;
  uint *in_RDX;
  int in_ESI;
  int in_EDI;
  int z;
  int i;
  int local_4;
  
  iVar1 = first_geq(in_RDX,in_ESI,in_EDI);
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    ceil((double)(*(int *)(in_RCX + (long)(iVar1 + -1) * 4) - in_RDX[iVar1 + -1]) / 2.0);
    if ((in_EDI - 1U < in_RDX[iVar1 + -1]) ||
       (*(uint *)(in_RCX + (long)(iVar1 + -1) * 4) < in_EDI + 1U)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int f(int h, int m, unsigned int* I2_start, unsigned int* I2_end)
{
    int i;
    i = first_geq(I2_start, m, h);
    if (i<1)
        return 0;
    int z = ceil(double(I2_end[i-1]-I2_start[i-1])/2);
    z = 1;
    if (I2_start[i-1]<=h-z && I2_end[i-1]>=h+z)
        return 1;
    return 0;
}